

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

ssize_t __thiscall
nestl::impl::list<int,_nestl::allocator<int>_>::splice
          (list<int,_nestl::allocator<int>_> *this,int __fdin,__off64_t *__offin,int __fdout,
          __off64_t *__offout,size_t __len,uint __flags)

{
  bool bVar1;
  list_node_base *node;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  ssize_t sVar2;
  ssize_t extraout_RAX;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  bool local_59;
  list_const_iterator<int> local_38;
  list_iterator<int> local_30;
  iterator j;
  list<int,_nestl::allocator<int>_> *param_2_local;
  list<int,_nestl::allocator<int>_> *this_local;
  const_iterator it_local;
  const_iterator pos_local;
  undefined7 uVar3;
  
  it_local.m_node = (list_node_base *)CONCAT44(in_register_00000034,__fdin);
  this_local = (list<int,_nestl::allocator<int>_> *)CONCAT44(in_register_0000000c,__fdout);
  j.m_node = (list_node_base *)__offin;
  node = list_const_iterator<int>::get_list_node((list_const_iterator<int> *)&this_local);
  list_iterator<int>::list_iterator(&local_30,node);
  list_iterator<int>::operator++(&local_30);
  bVar1 = list_const_iterator<int>::operator==(&it_local,(list_const_iterator<int> *)&this_local);
  local_59 = true;
  uVar3 = extraout_var;
  if (!bVar1) {
    list_const_iterator<int>::list_const_iterator(&local_38,&local_30);
    local_59 = list_const_iterator<int>::operator==(&it_local,&local_38);
    uVar3 = extraout_var_00;
  }
  sVar2 = CONCAT71(uVar3,local_59);
  if (local_59 == false) {
    list<int,nestl::allocator<int>>::
    transfer<nestl::impl::list_const_iterator<int>,nestl::impl::list_const_iterator<int>,nestl::impl::list_iterator<int>>
              ((list<int,nestl::allocator<int>> *)this,(list_const_iterator<int>)it_local.m_node,
               (list_const_iterator<int>)this_local,local_30);
    sVar2 = extraout_RAX;
  }
  return sVar2;
}

Assistant:

void
list<T, A>::splice(const_iterator pos, list&& /* other */, const_iterator it) NESTL_NOEXCEPT_SPEC
{
    iterator j = iterator(it.get_list_node());
    ++j;
    if ((pos == it) || (pos == j))
    {
        return;
    }

    this->transfer(pos, it, j);
}